

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O1

void __thiscall Liby::TcpServer::start(TcpServer *this)

{
  int iVar1;
  Poller *pPVar2;
  Channel *this_00;
  pointer __p;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  iVar1 = ((this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->fd_
  ;
  this->listenfd_ = iVar1;
  __p = (pointer)operator_new(0x70);
  pPVar2 = this->poller_;
  *(undefined8 *)&(__p->readEventCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__p->readEventCallback_).super__Function_base._M_functor + 8) = 0;
  (__p->readEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (__p->readEventCallback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__p->writEventCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__p->writEventCallback_).super__Function_base._M_functor + 8) = 0;
  (__p->writEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (__p->writEventCallback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__p->erroEventCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__p->erroEventCallback_).super__Function_base._M_functor + 8) = 0;
  (__p->erroEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (__p->erroEventCallback_)._M_invoker = (_Invoker_type)0x0;
  __p->readable_ = false;
  __p->writable_ = false;
  __p->old_readable_ = false;
  __p->old_writable_ = false;
  __p->fd_ = iVar1;
  __p->poller_ = pPVar2;
  if ((-1 < iVar1) && (pPVar2 != (Poller *)0x0)) {
    std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
              ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)&this->chan_,
               __p);
    this_00 = (this->chan_)._M_t.
              super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>._M_t.
              super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
              super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl;
    this_00->readable_ = true;
    local_38._8_8_ = 0;
    pcStack_20 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:19:17)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:19:17)>
               ::_M_manager;
    local_38._M_unused._M_object = this;
    std::function<void_()>::operator=(&this_00->readEventCallback_,(function<void_()> *)&local_38);
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:20:17)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:20:17)>
               ::_M_manager;
    local_58._M_unused._M_object = this;
    std::function<void_()>::operator=(&this_00->erroEventCallback_,(function<void_()> *)&local_58);
    Channel::addChannel(this_00);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    return;
  }
  __assert_fail("fd >= 0 && poller",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Channel.h"
                ,0xe,"Liby::Channel::Channel(Poller *, int)");
}

Assistant:

void TcpServer::start() {
    listenfd_ = socket_->fd();
    chan_ = std::make_unique<Channel>(poller_, listenfd_);
    chan_->enableRead()
        .onRead([this] { handleAcceptEvent(); })
        .onErro([this] { handleErroEvent(); })
        .addChannel();
}